

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O0

int __thiscall Imf_2_5::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  byte bVar1;
  int iVar2;
  BaseExc *this_00;
  undefined8 in_RCX;
  undefined1 *puVar3;
  int in_EDX;
  undefined1 *puVar4;
  undefined1 *in_RSI;
  long in_RDI;
  double dVar5;
  uLongf outSize;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  long local_58;
  int local_50;
  uint local_4c;
  byte *local_48;
  byte *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  int local_14;
  undefined1 *local_10;
  
  local_38 = in_RSI + in_EDX;
  local_30 = (undefined1 *)(*(long *)(in_RDI + 8) + (long)((in_EDX + 1) / 2));
  local_28 = *(undefined1 **)(in_RDI + 8);
  local_10 = in_RSI;
  while (puVar3 = local_10, local_10 < local_38) {
    puVar3 = local_10 + 1;
    puVar4 = local_28 + 1;
    *local_28 = *local_10;
    local_28 = puVar4;
    if (local_38 <= puVar3) break;
    local_10 = local_10 + 2;
    *local_30 = *puVar3;
    local_30 = local_30 + 1;
  }
  local_10 = puVar3;
  local_40 = *(byte **)(in_RDI + 8);
  local_48 = (byte *)(*(long *)(in_RDI + 8) + (long)in_EDX);
  bVar1 = *local_40;
  while( true ) {
    local_40 = local_40 + 1;
    local_4c = (uint)bVar1;
    if (local_48 <= local_40) break;
    local_50 = (*local_40 - local_4c) + 0x180;
    bVar1 = *local_40;
    *local_40 = (byte)local_50;
  }
  local_20 = in_RCX;
  local_14 = in_EDX;
  dVar5 = ceil((double)in_EDX * 1.01);
  local_58 = (long)((int)dVar5 + 100);
  iVar2 = ::compress(local_20,&local_58,*(undefined8 *)(in_RDI + 8),(long)local_14);
  if (iVar2 == 0) {
    return (int)local_58;
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
  __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
}

Assistant:

int
Zip::compress(const char *raw, int rawSize, char *compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char *t1 = _tmpBuffer;
        char *t2 = _tmpBuffer + (rawSize + 1) / 2;
        const char *stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
            *(t1++) = *(raw++);
            else
            break;

            if (raw < stop)
            *(t2++) = *(raw++);
            else
            break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char *t    = (unsigned char *) _tmpBuffer + 1;
        unsigned char *stop = (unsigned char *) _tmpBuffer + rawSize;
        int p = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p = t[0];
            t[0] = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //

    uLongf outSize = int(ceil(rawSize * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *)compressed, &outSize,
                (const Bytef *) _tmpBuffer, rawSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    return outSize;
}